

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O3

void __thiscall
TPZCreateApproximationSpace::BuildMesh(TPZCreateApproximationSpace *this,TPZCompMesh *cmesh)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  set<int,_std::less<int>,_std::allocator<int>_> materialids;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_58;
  
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_58._M_impl.super__Rb_tree_header._M_header;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var1 = (cmesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(cmesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &_Stack_58,(int *)(p_Var1 + 1));
  }
  BuildMesh(this,cmesh,(set<int,_std::less<int>,_std::allocator<int>_> *)&_Stack_58);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_58);
  return;
}

Assistant:

void TPZCreateApproximationSpace::BuildMesh(TPZCompMesh &cmesh) const {
    std::set<int> materialids;
    std::map<int,TPZMaterial *>::iterator it;
    for (it = cmesh.MaterialVec().begin(); it != cmesh.MaterialVec().end(); it++) {
        materialids.insert(it->first);
    }
    BuildMesh(cmesh,materialids);
}